

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesCacheEntryComposite.cxx
# Opt level: O1

void __thiscall
cmCursesCacheEntryComposite::~cmCursesCacheEntryComposite(cmCursesCacheEntryComposite *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  if (this->Label != (cmCursesLabelWidget *)0x0) {
    (*(this->Label->super_cmCursesWidget)._vptr_cmCursesWidget[1])();
  }
  if (this->IsNewLabel != (cmCursesLabelWidget *)0x0) {
    (*(this->IsNewLabel->super_cmCursesWidget)._vptr_cmCursesWidget[1])();
  }
  if (this->Entry != (cmCursesWidget *)0x0) {
    (*this->Entry->_vptr_cmCursesWidget[1])();
  }
  pcVar1 = (this->Key)._M_dataplus._M_p;
  paVar2 = &(this->Key).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

cmCursesCacheEntryComposite::~cmCursesCacheEntryComposite()
{
  delete this->Label;
  delete this->IsNewLabel;
  delete this->Entry;
}